

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::CwiseQuotient::forward_impl
          (CwiseQuotient *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  uint uVar8;
  int iVar10;
  uint uVar11;
  Index index_1;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  ulong uVar9;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 != 0x10) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x6c4,
                  "virtual void cnn::CwiseQuotient::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  pTVar2 = *ppTVar1;
  uVar9 = (ulong)(pTVar2->d).nd;
  iVar7 = 1;
  iVar10 = 1;
  if (uVar9 != 0) {
    uVar12 = 0;
    do {
      iVar10 = iVar10 * (pTVar2->d).d[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  uVar11 = iVar10 * (pTVar2->d).bd;
  pTVar3 = ppTVar1[1];
  uVar9 = (ulong)(pTVar3->d).nd;
  if (uVar9 != 0) {
    iVar7 = 1;
    uVar12 = 0;
    do {
      iVar7 = iVar7 * (pTVar3->d).d[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  uVar8 = iVar7 * (pTVar3->d).bd;
  uVar9 = (ulong)uVar8;
  if (uVar11 == uVar8) {
    uVar12 = (ulong)(fx->d).nd;
    iVar7 = 1;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        iVar7 = iVar7 * (fx->d).d[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    if (iVar7 * (fx->d).bd == uVar11) {
      pfVar4 = fx->v;
      uVar12 = uVar9;
      if ((((ulong)pfVar4 & 3) == 0) &&
         (uVar12 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 3), uVar9 <= uVar12)) {
        uVar12 = uVar9;
      }
      pfVar5 = pTVar2->v;
      pfVar6 = pTVar3->v;
      uVar13 = uVar9 - uVar12;
      uVar14 = uVar13 + 3;
      if (-1 < (long)uVar13) {
        uVar14 = uVar13;
      }
      if (uVar12 != 0) {
        uVar15 = 0;
        do {
          pfVar4[uVar15] = pfVar5[uVar15] / pfVar6[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      uVar14 = (uVar14 & 0xfffffffffffffffc) + uVar12;
      if (3 < (long)uVar13) {
        do {
          auVar16 = divps(*(undefined1 (*) [16])(pfVar5 + uVar12),
                          *(undefined1 (*) [16])(pfVar6 + uVar12));
          *(undefined1 (*) [16])(pfVar4 + uVar12) = auVar16;
          uVar12 = uVar12 + 4;
        } while ((long)uVar12 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar9) {
        do {
          pfVar4[uVar14] = pfVar5[uVar14] / pfVar6[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void CwiseQuotient::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("CwiseQuotient::forward not yet implemented for CUDA");
#else
  auto x1 = xs[0]->vec();
  auto x2 = xs[1]->vec();
  fx.vec() = x1.cwiseQuotient(x2);
#endif
}